

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

Dic<asl::String> __thiscall asl::String::split(String *this,String *sep1,String *sep2)

{
  int iVar1;
  int iVar2;
  String *pSVar3;
  String *in_RCX;
  String local_80;
  String local_68;
  int local_4c;
  int local_48;
  int j;
  int i;
  undefined1 local_38 [8];
  Array<asl::String> pairs;
  String *sep2_local;
  String *sep1_local;
  String *this_local;
  Dic<asl::String> *dic;
  
  pairs._a._7_1_ = 0;
  Dic<asl::String>::Dic((Dic<asl::String> *)this);
  split((String *)local_38,sep1);
  local_48 = 0;
  while( true ) {
    iVar1 = local_48;
    iVar2 = Array<asl::String>::length((Array<asl::String> *)local_38);
    if (iVar2 <= iVar1) break;
    pSVar3 = Array<asl::String>::operator[]((Array<asl::String> *)local_38,local_48);
    local_4c = indexOf(pSVar3,in_RCX,0);
    if (0 < local_4c) {
      pSVar3 = Array<asl::String>::operator[]((Array<asl::String> *)local_38,local_48);
      iVar1 = local_4c;
      iVar2 = length(in_RCX);
      substring(&local_68,pSVar3,iVar1 + iVar2);
      pSVar3 = Array<asl::String>::operator[]((Array<asl::String> *)local_38,local_48);
      substring(&local_80,pSVar3,0,local_4c);
      pSVar3 = Map<asl::String,_asl::String>::operator[]
                         ((Map<asl::String,_asl::String> *)this,&local_80);
      operator=(pSVar3,&local_68);
      ~String(&local_80);
      ~String(&local_68);
    }
    local_48 = local_48 + 1;
  }
  pairs._a._7_1_ = 1;
  Array<asl::String>::~Array((Array<asl::String> *)local_38);
  if ((pairs._a._7_1_ & 1) == 0) {
    Dic<asl::String>::~Dic((Dic<asl::String> *)this);
  }
  return (Map<asl::String,_asl::String>)(Map<asl::String,_asl::String>)this;
}

Assistant:

Dic<String> String::split(const String& sep1, const String& sep2) const
{
	Dic<String> dic;
	Array<String> pairs = split(sep1);
	for (int i = 0; i < pairs.length(); i++)
	{
		int j = pairs[i].indexOf(sep2);
		if (j > 0)
			dic[pairs[i].substring(0, j)] = pairs[i].substring(j + sep2.length());
	}
	return dic;
}